

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void btreeParseCellPtr(MemPage *pPage,u8 *pCell,CellInfo *pInfo)

{
  byte bVar1;
  ushort uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  u8 *puVar6;
  u8 *puVar7;
  uint uVar8;
  u16 uVar9;
  u8 *pIter;
  ulong uVar10;
  
  bVar1 = *pCell;
  uVar8 = (uint)bVar1;
  puVar6 = pCell;
  if ((char)bVar1 < '\0') {
    uVar8 = bVar1 & 0x7f;
    uVar10 = 0;
    do {
      lVar3 = uVar10 + 1;
      uVar5 = uVar10 + 1;
      uVar8 = pCell[lVar3] & 0x7f | uVar8 << 7;
      if (6 < uVar10) break;
      uVar10 = uVar5;
    } while ((char)pCell[lVar3] < '\0');
    puVar6 = pCell + uVar5;
  }
  bVar1 = puVar6[1];
  uVar10 = (ulong)bVar1;
  if ((char)bVar1 < '\0') {
    uVar4 = puVar6[2] & 0x7f | (bVar1 & 0x7f) << 7;
    uVar10 = (ulong)uVar4;
    if ((char)puVar6[2] < '\0') {
      uVar4 = puVar6[3] & 0x7f | uVar4 << 7;
      uVar10 = (ulong)uVar4;
      if ((char)puVar6[3] < '\0') {
        uVar10 = (ulong)(puVar6[4] & 0x7f | uVar4 << 7);
        if ((char)puVar6[4] < '\0') {
          uVar10 = (ulong)(puVar6[5] & 0x7f) | uVar10 << 7;
          if ((char)puVar6[5] < '\0') {
            uVar10 = (ulong)(puVar6[6] & 0x7f) | uVar10 << 7;
            if ((char)puVar6[6] < '\0') {
              uVar10 = (ulong)(puVar6[7] & 0x7f) | uVar10 << 7;
              if ((char)puVar6[7] < '\0') {
                uVar10 = (ulong)(puVar6[8] & 0x7f) | uVar10 << 7;
                if ((char)puVar6[8] < '\0') {
                  puVar7 = puVar6 + 9;
                  uVar10 = uVar10 << 8 | (ulong)puVar6[9];
                }
                else {
                  puVar7 = puVar6 + 8;
                }
              }
              else {
                puVar7 = puVar6 + 7;
              }
            }
            else {
              puVar7 = puVar6 + 6;
            }
          }
          else {
            puVar7 = puVar6 + 5;
          }
        }
        else {
          puVar7 = puVar6 + 4;
        }
      }
      else {
        puVar7 = puVar6 + 3;
      }
    }
    else {
      puVar7 = puVar6 + 2;
    }
  }
  else {
    puVar7 = puVar6 + 1;
  }
  pInfo->nKey = uVar10;
  pInfo->nPayload = uVar8;
  pInfo->pPayload = puVar7 + 1;
  if (pPage->maxLocal < uVar8) {
    uVar2 = pPage->minLocal;
    uVar8 = (pInfo->nPayload - (uint)uVar2) % (pPage->pBt->usableSize - 4) + (uint)uVar2;
    if ((int)(uint)pPage->maxLocal < (int)uVar8) {
      uVar8 = (uint)uVar2;
    }
    pInfo->nLocal = (u16)uVar8;
    pInfo->nSize = (((u16)uVar8 + (short)*(undefined4 *)&pInfo->pPayload) - (short)pCell) + 4;
    return;
  }
  uVar4 = ((int)(puVar7 + 1) - (int)pCell) + uVar8;
  uVar9 = 4;
  if ((uVar4 & 0xfffc) != 0) {
    uVar9 = (u16)uVar4;
  }
  pInfo->nSize = uVar9;
  pInfo->nLocal = (u16)uVar8;
  return;
}

Assistant:

static void btreeParseCellPtr(
  MemPage *pPage,         /* Page containing the cell */
  u8 *pCell,              /* Pointer to the cell text. */
  CellInfo *pInfo         /* Fill in this structure */
){
  u8 *pIter;              /* For scanning through pCell */
  u32 nPayload;           /* Number of bytes of cell payload */
  u64 iKey;               /* Extracted Key value */

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  assert( pPage->leaf==0 || pPage->leaf==1 );
  assert( pPage->intKeyLeaf );
  assert( pPage->childPtrSize==0 );
  pIter = pCell;

  /* The next block of code is equivalent to:
  **
  **     pIter += getVarint32(pIter, nPayload);
  **
  ** The code is inlined to avoid a function call.
  */
  nPayload = *pIter;
  if( nPayload>=0x80 ){
    u8 *pEnd = &pIter[8];
    nPayload &= 0x7f;
    do{
      nPayload = (nPayload<<7) | (*++pIter & 0x7f);
    }while( (*pIter)>=0x80 && pIter<pEnd );
  }
  pIter++;

  /* The next block of code is equivalent to:
  **
  **     pIter += getVarint(pIter, (u64*)&pInfo->nKey);
  **
  ** The code is inlined and the loop is unrolled for performance.
  ** This routine is a high-runner.
  */
  iKey = *pIter;
  if( iKey>=0x80 ){
    u8 x;
    iKey = ((iKey&0x7f)<<7) | ((x = *++pIter) & 0x7f);
    if( x>=0x80 ){
      iKey = (iKey<<7) | ((x =*++pIter) & 0x7f);
      if( x>=0x80 ){
        iKey = (iKey<<7) | ((x = *++pIter) & 0x7f);
        if( x>=0x80 ){
          iKey = (iKey<<7) | ((x = *++pIter) & 0x7f);
          if( x>=0x80 ){
            iKey = (iKey<<7) | ((x = *++pIter) & 0x7f);
            if( x>=0x80 ){
              iKey = (iKey<<7) | ((x = *++pIter) & 0x7f);
              if( x>=0x80 ){
                iKey = (iKey<<7) | ((x = *++pIter) & 0x7f);
                if( x>=0x80 ){
                  iKey = (iKey<<8) | (*++pIter);
                }
              }
            }
          }
        }
      }
    }
  }
  pIter++;

  pInfo->nKey = *(i64*)&iKey;
  pInfo->nPayload = nPayload;
  pInfo->pPayload = pIter;
  testcase( nPayload==pPage->maxLocal );
  testcase( nPayload==(u32)pPage->maxLocal+1 );
  if( nPayload<=pPage->maxLocal ){
    /* This is the (easy) common case where the entire payload fits
    ** on the local page.  No overflow is required.
    */
    pInfo->nSize = nPayload + (u16)(pIter - pCell);
    if( pInfo->nSize<4 ) pInfo->nSize = 4;
    pInfo->nLocal = (u16)nPayload;
  }else{
    btreeParseCellAdjustSizeForOverflow(pPage, pCell, pInfo);
  }
}